

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

wchar_t cmd_get_arg_point(command *cmd,char *arg,loc_conflict *grid)

{
  wchar_t wVar1;
  cmd_arg_data cStack_28;
  wchar_t err;
  cmd_arg_data data;
  loc_conflict *grid_local;
  char *arg_local;
  command *cmd_local;
  
  data = (cmd_arg_data)grid;
  grid_local = (loc_conflict *)arg;
  arg_local = (char *)cmd;
  wVar1 = cmd_get_arg(cmd,arg,arg_POINT,&stack0xffffffffffffffd8);
  if (wVar1 == L'\0') {
    (data.obj)->kind = (object_kind *)cStack_28;
  }
  return wVar1;
}

Assistant:

int cmd_get_arg_point(struct command *cmd, const char *arg, struct loc *grid)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_POINT, &data)) == CMD_OK) {
		*grid = data.point;
	}

	return err;
}